

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_bitreader.h
# Opt level: O2

unsigned_long __thiscall LLVMBC::BitReader::fixed<unsigned_long>(BitReader *this,size_t bitWidth)

{
  byte abVar1 [8];
  byte scratch [8];
  
  scratch[0] = '\0';
  scratch[1] = '\0';
  scratch[2] = '\0';
  scratch[3] = '\0';
  scratch[4] = '\0';
  scratch[5] = '\0';
  scratch[6] = '\0';
  scratch[7] = '\0';
  if (bitWidth < 0x41) {
    ReadBits(this,bitWidth,scratch);
    abVar1[0] = scratch[0];
    abVar1[1] = scratch[1];
    abVar1[2] = scratch[2];
    abVar1[3] = scratch[3];
    abVar1[4] = scratch[4];
    abVar1[5] = scratch[5];
    abVar1[6] = scratch[6];
    abVar1[7] = scratch[7];
    return (unsigned_long)abVar1;
  }
  __assert_fail("bitWidth <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_bitreader.h"
                ,0x53,"T LLVMBC::BitReader::fixed(const size_t) [T = unsigned long]");
}

Assistant:

T fixed(const size_t bitWidth)
  {
    byte scratch[8] = {};

    assert(bitWidth <= 64);

    ReadBits(bitWidth, scratch);

    T ret;
    memcpy(&ret, scratch, sizeof(T));
    return ret;
  }